

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

uint64_t uv_get_available_memory(void)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t total;
  uint64_t current;
  uint64_t constrained;
  char buf [1024];
  uint64_t local_10;
  
  iVar1 = uv__slurp("/proc/self/cgroup",(char *)&constrained,0x400);
  if (iVar1 == 0) {
    local_10 = uv__get_cgroup_constrained_memory((char *)&constrained);
    if (local_10 == 0) {
      local_10 = uv_get_free_memory();
    }
    else {
      uVar2 = uv_get_total_memory();
      if (uVar2 < local_10) {
        local_10 = uv_get_free_memory();
      }
      else {
        iVar1 = strncmp((char *)&constrained,"0::/",4);
        if (iVar1 == 0) {
          total = uv__get_cgroup2_current_memory((char *)&constrained);
        }
        else {
          total = uv__get_cgroup1_current_memory((char *)&constrained);
        }
        if (local_10 < total) {
          local_10 = 0;
        }
        else {
          local_10 = local_10 - total;
        }
      }
    }
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

uint64_t uv_get_available_memory(void) {
  char buf[1024];
  uint64_t constrained;
  uint64_t current;
  uint64_t total;

  if (uv__slurp("/proc/self/cgroup", buf, sizeof(buf)))
    return 0;

  constrained = uv__get_cgroup_constrained_memory(buf);
  if (constrained == 0)
    return uv_get_free_memory();

  total = uv_get_total_memory();
  if (constrained > total)
    return uv_get_free_memory();

  /* In the case of cgroupv2, we'll only have a single entry. */
  if (strncmp(buf, "0::/", 4))
    current = uv__get_cgroup1_current_memory(buf);
  else
    current = uv__get_cgroup2_current_memory(buf);

  /* memory usage can be higher than the limit (for short bursts of time) */
  if (constrained < current)
    return 0;

  return constrained - current;
}